

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

crypto_word_t poly3_from_poly_checked(poly3 *out,poly *in)

{
  ushort uVar1;
  crypto_word_t cVar2;
  ulong uVar3;
  crypto_word_t s_bit;
  uint uStack_4c;
  uint16_t expected;
  uint16_t mod3;
  uint16_t v;
  uint i;
  crypto_word_t ok;
  ulong uStack_38;
  uint shift;
  crypto_word_t a;
  crypto_word_t s;
  crypto_word_t *words_a;
  crypto_word_t *words_s;
  poly *in_local;
  poly3 *out_local;
  
  s = (crypto_word_t)&out->a;
  a = 0;
  uStack_38 = 0;
  ok._4_4_ = 0;
  _mod3 = 0xffffffffffffffff;
  words_a = (crypto_word_t *)out;
  for (uStack_4c = 0; uStack_4c < 0x2bd; uStack_4c = uStack_4c + 1) {
    uVar1 = (in->field_0).v[uStack_4c] & 3;
    uVar1 = uVar1 ^ (ushort)((int)(uint)uVar1 >> 1);
    cVar2 = constant_time_eq_w((ulong)(in->field_0).v[uStack_4c],
                               (ulong)((((int)(uint)uVar1 >> 1) - 1U ^ 0xffffffff) & 0xffff |
                                      (uint)uVar1) % 0x2000);
    _mod3 = cVar2 & _mod3;
    uVar3 = (long)(int)(uVar1 & 2) << 0x3e;
    a = uVar3 | a >> 1;
    uStack_38 = uVar3 | (long)(int)(uVar1 & 1) << 0x3f | uStack_38 >> 1;
    ok._4_4_ = ok._4_4_ + 1;
    if (ok._4_4_ == 0x40) {
      *words_a = a;
      words_a = words_a + 1;
      *(ulong *)s = uStack_38;
      s = s + 8;
      uStack_38 = 0;
      a = 0;
      ok._4_4_ = 0;
    }
  }
  *words_a = a >> (0x40U - (char)ok._4_4_ & 0x3f);
  *(ulong *)s = uStack_38 >> (0x40U - (char)ok._4_4_ & 0x3f);
  return _mod3;
}

Assistant:

static crypto_word_t poly3_from_poly_checked(struct poly3 *out,
                                             const struct poly *in) {
  crypto_word_t *words_s = out->s.v;
  crypto_word_t *words_a = out->a.v;
  crypto_word_t s = 0;
  crypto_word_t a = 0;
  unsigned shift = 0;
  crypto_word_t ok = CONSTTIME_TRUE_W;

  for (unsigned i = 0; i < N; i++) {
    const uint16_t v = in->v[i];
    // Maps {0, 1, Q-1} to {0, 1, 2}.
    uint16_t mod3 = v & 3;
    mod3 ^= mod3 >> 1;
    const uint16_t expected = (uint16_t)((~((mod3 >> 1) - 1)) | mod3) % Q;
    ok &= constant_time_eq_w(v, expected);

    s >>= 1;
    const crypto_word_t s_bit = (crypto_word_t)(mod3 & 2)
                                << (BITS_PER_WORD - 2);
    s |= s_bit;
    a >>= 1;
    a |= s_bit | (crypto_word_t)(mod3 & 1) << (BITS_PER_WORD - 1);
    shift++;

    if (shift == BITS_PER_WORD) {
      *words_s = s;
      words_s++;
      *words_a = a;
      words_a++;
      s = a = 0;
      shift = 0;
    }
  }

  s >>= BITS_PER_WORD - shift;
  a >>= BITS_PER_WORD - shift;
  *words_s = s;
  *words_a = a;

  return ok;
}